

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

StartLayout valid_layout_start(Env *env,Lexed next)

{
  StartLayout SVar1;
  _Bool _Var2;
  ContextSort local_20;
  ContextSort sort;
  Lexed next_local;
  Env *env_local;
  StartLayout start;
  
  env_local._0_4_ = valid_layout_start_sym(env);
  env_local._4_4_ = NoContext;
  _Var2 = uninitialized(env);
  if ((_Var2) || ((Symbol)env_local == FAIL)) goto LAB_0010e12c;
  local_20 = layout_sort((Symbol)env_local);
  if (next != LBar) {
    if (next == LBraceOpen) {
      _Var2 = newline_active(env);
      if (_Var2) goto LAB_0010e12c;
      local_20 = Braces;
      env_local._0_4_ = START_EXPLICIT;
    }
    else if (local_20 == MultiWayIfLayout) goto LAB_0010e12c;
  }
  env_local._4_4_ = local_20;
LAB_0010e12c:
  SVar1.sort = env_local._4_4_;
  SVar1.sym = (Symbol)env_local;
  return SVar1;
}

Assistant:

static StartLayout valid_layout_start(Env *env, Lexed next) {
  StartLayout start = {.sym = valid_layout_start_sym(env), .sort = NoContext};
  if (uninitialized(env) || start.sym == FAIL) return start;
  ContextSort sort = layout_sort(start.sym);
  switch (next) {
    case LBar:
      break;
    case LBraceOpen:
      if (newline_active(env)) return start;
      sort = Braces;
      start.sym = START_EXPLICIT;
      break;
    default:
      if (sort == MultiWayIfLayout) return start;
      break;
  }
  start.sort = sort;
  return start;
}